

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Glucose.cpp
# Opt level: O1

Lit __thiscall Gluco::Solver::pickBranchLit(Solver *this)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  double dVar4;
  
  dVar4 = this->random_seed * 1389796.0;
  dVar4 = dVar4 - (double)(int)(dVar4 / 2147483647.0) * 2147483647.0;
  this->random_seed = dVar4;
  iVar2 = -1;
  if ((dVar4 / 2147483647.0 < this->random_var_freq) &&
     (iVar1 = (this->order_heap).heap.sz, iVar1 != 0)) {
    dVar4 = dVar4 * 1389796.0 - (double)(int)((dVar4 * 1389796.0) / 2147483647.0) * 2147483647.0;
    this->random_seed = dVar4;
    iVar2 = (int)((double)iVar1 * (dVar4 / 2147483647.0));
    if (iVar1 <= iVar2) {
      __assert_fail("index < heap.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/glucose/Heap.h"
                    ,0x53,
                    "int Gluco::Heap<Gluco::Solver::VarOrderLt>::operator[](int) const [Comp = Gluco::Solver::VarOrderLt]"
                   );
    }
    iVar2 = (this->order_heap).heap.data[iVar2];
    if ((((this->assigns).data[iVar2].value & 2) != 0) && ((this->decision).data[iVar2] != '\0')) {
      this->rnd_decisions = this->rnd_decisions + 1;
    }
  }
  while( true ) {
    if (((iVar2 != -1) && (((this->assigns).data[iVar2].value & 2) != 0)) &&
       ((this->decision).data[iVar2] != '\0')) goto LAB_005b8202;
    if ((this->order_heap).heap.sz == 0) break;
    iVar2 = Heap<Gluco::Solver::VarOrderLt>::removeMin(&this->order_heap);
  }
  iVar2 = -1;
LAB_005b8202:
  if (iVar2 == -1) {
    iVar2 = -2;
  }
  else {
    if (this->rnd_pol == true) {
      dVar4 = this->random_seed * 1389796.0;
      dVar4 = dVar4 - (double)(int)(dVar4 / 2147483647.0) * 2147483647.0;
      this->random_seed = dVar4;
      bVar3 = dVar4 / 2147483647.0 < 0.5;
    }
    else {
      bVar3 = (this->polarity).data[iVar2] != '\0';
    }
    iVar2 = (uint)bVar3 + iVar2 * 2;
  }
  return (Lit)iVar2;
}

Assistant:

Lit Solver::pickBranchLit()
{
    Var next = var_Undef;

    // Random decision:
    if (drand(random_seed) < random_var_freq && !order_heap.empty()){
        next = order_heap[irand(random_seed,order_heap.size())];
        if (value(next) == l_Undef && decision[next])
            rnd_decisions++; }

    // Activity based decision:
    while (next == var_Undef || value(next) != l_Undef || !decision[next])
        if (order_heap.empty()){
            next = var_Undef;
            break;
        }else
            next = order_heap.removeMin();
    
    return next == var_Undef ? lit_Undef : mkLit(next, rnd_pol ? drand(random_seed) < 0.5 : (polarity[next] != 0));
}